

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiInstCount(Fts5Context *pCtx,int *pnInst)

{
  undefined4 *in_RSI;
  long in_RDI;
  int rc;
  Fts5Cursor *pCsr;
  int local_1c;
  
  local_1c = 0;
  if (((*(uint *)(in_RDI + 0x50) & 8) != 0) && (local_1c = fts5CacheInstArray(pCsr), local_1c != 0))
  {
    return local_1c;
  }
  *in_RSI = *(undefined4 *)(in_RDI + 0xac);
  return local_1c;
}

Assistant:

static int fts5ApiInstCount(Fts5Context *pCtx, int *pnInst){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  int rc = SQLITE_OK;
  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_INST)==0
   || SQLITE_OK==(rc = fts5CacheInstArray(pCsr)) ){
    *pnInst = pCsr->nInstCount;
  }
  return rc;
}